

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

uint vkt::anon_unknown_0::chooseRandom<unsigned_int>
               (Random *rng,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *values)

{
  deUint32 dVar1;
  size_type sVar2;
  reference puVar3;
  _Rb_tree_const_iterator<unsigned_int> local_28;
  const_iterator iter;
  size_t ndx;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *values_local;
  Random *rng_local;
  
  dVar1 = de::Random::getUint32(rng);
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (values);
  iter._M_node = (_Base_ptr)((ulong)dVar1 % sVar2);
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin(values)
  ;
  for (; iter._M_node != (_Base_ptr)0x0;
      iter._M_node = (_Base_ptr)((long)&iter._M_node[-1]._M_right + 7)) {
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_28,0);
  }
  puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_28);
  return *puVar3;
}

Assistant:

T chooseRandom (de::Random& rng, const set<T>& values)
{
	size_t							ndx		= ((size_t)rng.getUint32()) % values.size();
	typename set<T>::const_iterator	iter	= values.begin();

	for (; ndx > 0; ndx--)
		iter++;

	return *iter;
}